

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_bytestring.cc
# Opt level: O2

string * __thiscall
binpac::std_string_abi_cxx11_(string *__return_storage_ptr__,binpac *this,bytestring *s)

{
  int iVar1;
  long lVar2;
  
  lVar2 = *(long *)this;
  iVar1 = *(int *)(this + 8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,lVar2,iVar1 + lVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string std_string(bytestring const* s)
	{
	return std::string((const char*)s->begin(), (const char*)s->end());
	}